

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idefs.h
# Opt level: O0

bool __thiscall Am_Input_Char::operator==(Am_Input_Char *this,Am_Input_Char i)

{
  byte bVar1;
  Am_Input_Char *this_local;
  Am_Input_Char i_local;
  
  this_local._0_2_ = i.code;
  if ((((short)this_local == 0x103) && (this->code != 0x103)) ||
     ((this->code == 0x103 && ((short)this_local != 0x103)))) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = ::Am_Input_Char::helper_check_equal((Am_Input_Char *)this);
    this_local._7_1_ = (bool)(bVar1 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(Am_Input_Char i) const
  {
    //quick exit for mouse_moved == something else, for efficiency.
    // Mouse-moved doesn't match ANY-* so is an easy test
    if ((i.code == Am_MOUSE_MOVED && code != Am_MOUSE_MOVED) ||
        (code == Am_MOUSE_MOVED && i.code != Am_MOUSE_MOVED))
      return false;
    else
      return helper_check_equal(i);
  }